

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

char * mpack_read_utf8_inplace(mpack_reader_t *reader,size_t count)

{
  _Bool _Var1;
  uint8_t *str;
  
  str = (uint8_t *)mpack_read_bytes_inplace_notrack(reader,count);
  if (reader->error == mpack_ok) {
    _Var1 = mpack_utf8_check_impl(str,count,true);
    if (!_Var1) {
      reader->error = mpack_error_type;
      reader->end = reader->data;
      if (reader->error_fn != (mpack_reader_error_t)0x0) {
        (*reader->error_fn)(reader,mpack_error_type);
      }
      str = (uint8_t *)0x0;
    }
  }
  return (char *)str;
}

Assistant:

const char* mpack_read_utf8_inplace(mpack_reader_t* reader, size_t count) {
    mpack_reader_track_str_bytes_all(reader, count);
    const char* str = mpack_read_bytes_inplace_notrack(reader, count);

    if (mpack_reader_error(reader) == mpack_ok && !mpack_utf8_check(str, count)) {
        mpack_reader_flag_error(reader, mpack_error_type);
        return NULL;
    }

    return str;
}